

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_map_forEach(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  long lVar3;
  JSValue v;
  JSValue v_00;
  int iVar4;
  JSRefCountHeader *p;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  JSValue func_obj;
  JSValue JVar10;
  JSValue JVar11;
  int64_t iStackY_b0;
  ulong local_a0;
  int64_t local_98;
  JSValueUnion local_88;
  int64_t iStack_80;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_68;
  int64_t local_60;
  long local_50;
  JSValueUnion local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_38 = this_val.tag;
  local_40 = this_val.u;
  pvVar5 = JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  iStackY_b0 = 6;
  if (pvVar5 != (void *)0x0) {
    JVar1 = (JSValueUnion)(argv->u).ptr;
    iVar2 = argv->tag;
    if (argc < 2) {
      local_98 = 3;
      uVar6 = 0;
      local_a0 = 0;
    }
    else {
      local_98 = argv[1].tag;
      uVar6 = (ulong)argv[1].u.ptr & 0xffffffff;
      local_a0 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
    }
    iVar4 = check_function(ctx,*argv);
    if (iVar4 == 0) {
      local_50 = (long)pvVar5 + 8;
      lVar8 = local_50;
      lVar9 = *(long *)((long)pvVar5 + 0x10);
      local_48 = JVar1;
      while (lVar9 != lVar8) {
        if (*(int *)(lVar9 + -0x14) == 0) {
          *(int *)(lVar9 + -0x18) = *(int *)(lVar9 + -0x18) + 1;
          local_78 = (JSValueUnion)((JSValueUnion *)(lVar9 + 0x20))->ptr;
          iStack_70 = *(int64_t *)(lVar9 + 0x28);
          if (0xfffffff4 < (uint)iStack_70) {
            *(int *)local_78.ptr = *local_78.ptr + 1;
          }
          local_88 = local_78;
          iStack_80 = iStack_70;
          if (magic == 0) {
            local_88 = (JSValueUnion)((JSValueUnion *)(lVar9 + 0x30))->ptr;
            iStack_80 = *(int64_t *)(lVar9 + 0x38);
            if (0xfffffff4 < (uint)iStack_80) {
              *(int *)local_88.ptr = *local_88.ptr + 1;
            }
          }
          local_68 = local_40;
          local_60 = local_38;
          JVar11.tag = local_98;
          JVar11.u.ptr = (void *)(local_a0 | uVar6);
          func_obj.tag = iVar2;
          func_obj.u.float64 = local_48.float64;
          JVar11 = JS_Call(ctx,func_obj,JVar11,3,(JSValue *)&local_88);
          iStackY_b0 = JVar11.tag;
          v.tag = iStack_80;
          v.u.ptr = local_88.ptr;
          JS_FreeValue(ctx,v);
          if (magic == 0) {
            v_00.tag = iStack_70;
            v_00.u.ptr = local_78.ptr;
            JS_FreeValue(ctx,v_00);
          }
          lVar3 = *(long *)(lVar9 + 8);
          map_decref_record(ctx->rt,(JSMapRecord *)(lVar9 + -0x18));
          if ((int)JVar11.tag == 6) {
            uVar7 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
            uVar6 = (ulong)JVar11.u.ptr & 0xffffffff;
            goto LAB_0013b8ba;
          }
          JS_FreeValue(ctx,JVar11);
          lVar8 = local_50;
          lVar9 = lVar3;
        }
        else {
          lVar9 = *(long *)(lVar9 + 8);
        }
      }
      uVar7 = 0;
      iStackY_b0 = 3;
      uVar6 = 0;
      goto LAB_0013b8ba;
    }
  }
  uVar6 = 0;
  uVar7 = 0;
LAB_0013b8ba:
  JVar10.u.ptr = (void *)(uVar6 | uVar7);
  JVar10.tag = iStackY_b0;
  return JVar10;
}

Assistant:

static JSValue js_map_forEach(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSValueConst func, this_arg;
    JSValue ret, args[3];
    struct list_head *el;
    JSMapRecord *mr;

    if (!s)
        return JS_EXCEPTION;
    func = argv[0];
    if (argc > 1)
        this_arg = argv[1];
    else
        this_arg = JS_UNDEFINED;
    if (check_function(ctx, func))
        return JS_EXCEPTION;
    /* Note: the list can be modified while traversing it, but the
       current element is locked */
    el = s->records.next;
    while (el != &s->records) {
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty) {
            mr->ref_count++;
            /* must duplicate in case the record is deleted */
            args[1] = JS_DupValue(ctx, mr->key);
            if (magic)
                args[0] = args[1];
            else
                args[0] = JS_DupValue(ctx, mr->value);
            args[2] = (JSValue)this_val;
            ret = JS_Call(ctx, func, this_arg, 3, (JSValueConst *)args);
            JS_FreeValue(ctx, args[0]);
            if (!magic)
                JS_FreeValue(ctx, args[1]);
            el = el->next;
            map_decref_record(ctx->rt, mr);
            if (JS_IsException(ret))
                return ret;
            JS_FreeValue(ctx, ret);
        } else {
            el = el->next;
        }
    }
    return JS_UNDEFINED;
}